

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_odc.c
# Opt level: O2

int archive_write_odc_close(archive_write *a)

{
  int iVar1;
  archive_entry *entry;
  
  entry = archive_entry_new2((archive_conflict *)0x0);
  if (entry == (archive_entry *)0x0) {
    iVar1 = -0x1e;
  }
  else {
    archive_entry_set_nlink(entry,1);
    archive_entry_set_size(entry,0);
    archive_entry_set_pathname(entry,"TRAILER!!!");
    iVar1 = write_header(a,entry);
    archive_entry_free(entry);
  }
  return iVar1;
}

Assistant:

static int
archive_write_odc_close(struct archive_write *a)
{
	int er;
	struct archive_entry *trailer;

	trailer = archive_entry_new2(NULL);
	if (trailer == NULL) {
		return ARCHIVE_FATAL;
	}
	/* nlink = 1 here for GNU cpio compat. */
	archive_entry_set_nlink(trailer, 1);
	archive_entry_set_size(trailer, 0);
	archive_entry_set_pathname(trailer, "TRAILER!!!");
	er = write_header(a, trailer);
	archive_entry_free(trailer);
	return (er);
}